

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ras_dec.c
# Opt level: O0

int ras_validate(jas_stream_t *in)

{
  int iVar1;
  int iVar2;
  uint_fast32_t magic;
  int local_20;
  int n;
  int i;
  uchar buf [4];
  jas_stream_t *in_local;
  
  _i = in;
  iVar1 = jas_stream_read(in,&n,4);
  local_20 = iVar1;
  if (-1 < iVar1) {
    do {
      local_20 = local_20 + -1;
      if (local_20 < 0) {
        if (iVar1 < 4) {
          return -1;
        }
        if (((ulong)(byte)n << 0x18 | (ulong)n._1_1_ << 0x10 | (ulong)n._2_1_ << 8 | (ulong)n._3_1_)
            == 0x59a66a95) {
          return 0;
        }
        return -1;
      }
      iVar2 = jas_stream_ungetc(_i,(uint)*(byte *)((long)&n + (long)local_20));
    } while (iVar2 != -1);
  }
  return -1;
}

Assistant:

int ras_validate(jas_stream_t *in)
{
	jas_uchar buf[RAS_MAGICLEN];
	int i;
	int n;
	uint_fast32_t magic;

	assert(JAS_STREAM_MAXPUTBACK >= RAS_MAGICLEN);

	/* Read the validation data (i.e., the data used for detecting
	  the format). */
	if ((n = jas_stream_read(in, buf, RAS_MAGICLEN)) < 0) {
		return -1;
	}

	/* Put the validation data back onto the stream, so that the
	  stream position will not be changed. */
	for (i = n - 1; i >= 0; --i) {
		if (jas_stream_ungetc(in, buf[i]) == EOF) {
			return -1;
		}
	}

	/* Did we read enough data? */
	if (n < RAS_MAGICLEN) {
		return -1;
	}

	magic = (JAS_CAST(uint_fast32_t, buf[0]) << 24) |
	  (JAS_CAST(uint_fast32_t, buf[1]) << 16) |
	  (JAS_CAST(uint_fast32_t, buf[2]) << 8) |
	  buf[3];

	/* Is the signature correct for the Sun Rasterfile format? */
	if (magic != RAS_MAGIC) {
		return -1;
	}
	return 0;
}